

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::MergeFrom(Message *this,Message *from)

{
  int iVar1;
  undefined4 extraout_var;
  _func_void_Message_ptr_Message_ptr *local_48;
  __0 local_31;
  _func_void_Message_ptr_Message_ptr *local_30;
  _func_void_Message_ptr_Message_ptr *merge_to_from;
  ClassData *class_from;
  ClassData *class_to;
  Message *from_local;
  Message *this_local;
  
  class_to = (ClassData *)from;
  from_local = this;
  iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])();
  class_from = (ClassData *)CONCAT44(extraout_var,iVar1);
  merge_to_from =
       (_func_void_Message_ptr_Message_ptr *)(**(code **)(class_to->copy_to_from + 0x90))();
  if (class_from == (ClassData *)0x0) {
    local_48 = (_func_void_Message_ptr_Message_ptr *)0x0;
  }
  else {
    local_48 = class_from->merge_to_from;
  }
  local_30 = local_48;
  if ((class_from == (ClassData *)0x0) || (class_from != (ClassData *)merge_to_from)) {
    local_30 = MergeFrom(google::protobuf::Message_const&)::$_0::operator_cast_to_function_pointer
                         (&local_31);
  }
  (*local_30)(this,(Message *)class_to);
  return;
}

Assistant:

void Message::MergeFrom(const Message& from) {
  auto* class_to = GetClassData();
  auto* class_from = from.GetClassData();
  auto* merge_to_from = class_to ? class_to->merge_to_from : nullptr;
  if (class_to == nullptr || class_to != class_from) {
    merge_to_from = [](Message* to, const Message& from) {
      ReflectionOps::Merge(from, to);
    };
  }
  merge_to_from(this, from);
}